

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession.c
# Opt level: O0

int mg_session_read_chunk(mg_session *session)

{
  __uint16_t _Var1;
  int iVar2;
  mg_session *in_RDI;
  int status;
  uint16_t chunk_size;
  undefined4 in_stack_ffffffffffffffe8;
  undefined2 in_stack_ffffffffffffffec;
  __uint16_t in_stack_ffffffffffffffee;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mg_transport_suspend_until_ready_to_read((mg_transport *)0x107a77);
  iVar2 = mg_transport_recv((mg_transport *)in_RDI,
                            (char *)CONCAT26(in_stack_ffffffffffffffee,
                                             CONCAT24(in_stack_ffffffffffffffec,
                                                      in_stack_ffffffffffffffe8)),0x107a8f);
  if (iVar2 == 0) {
    _Var1 = __bswap_16(in_stack_ffffffffffffffee);
    if (_Var1 == 0) {
      iVar2 = 0;
    }
    else {
      iVar2 = mg_session_ensure_space_for_chunk
                        ((mg_session *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8)
                         ,(size_t)in_RDI);
      if (iVar2 == 0) {
        mg_transport_suspend_until_ready_to_read((mg_transport *)0x107b0b);
        iVar2 = mg_transport_recv((mg_transport *)in_RDI,
                                  (char *)CONCAT26(_Var1,CONCAT24(in_stack_ffffffffffffffec,iVar2)),
                                  0x107b32);
        if (iVar2 == 0) {
          in_RDI->in_end = (ulong)_Var1 + in_RDI->in_end;
          iVar2 = 1;
        }
        else {
          mg_session_set_error(in_RDI,"failed to receive chunk data");
          iVar2 = -2;
        }
      }
    }
  }
  else {
    mg_session_set_error(in_RDI,"failed to receive chunk size");
    iVar2 = -2;
  }
  return iVar2;
}

Assistant:

int mg_session_read_chunk(mg_session *session) {
  uint16_t chunk_size;
  mg_transport_suspend_until_ready_to_read(session->transport);
  if (mg_transport_recv(session->transport, (char *)&chunk_size, 2) != 0) {
    mg_session_set_error(session, "failed to receive chunk size");
    return MG_ERROR_RECV_FAILED;
  }
  chunk_size = be16toh(chunk_size);
  if (chunk_size == 0) {
    return 0;
  }
  {
    int status = mg_session_ensure_space_for_chunk(session, chunk_size);
    if (status != 0) {
      return status;
    }
  }
  mg_transport_suspend_until_ready_to_read(session->transport);
  if (mg_transport_recv(session->transport,
                        session->in_buffer + session->in_end,
                        chunk_size) != 0) {
    mg_session_set_error(session, "failed to receive chunk data");
    return MG_ERROR_RECV_FAILED;
  }
  session->in_end += chunk_size;
  return 1;
}